

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalTeeExpr
          (BinaryReaderInterp *this,Index param_1)

{
  Istream *this_00;
  pointer pTVar1;
  pointer pTVar2;
  Result RVar3;
  Index IVar4;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,param_1,&local_b8);
  RVar3 = SharedValidator::OnLocalTee(&this->validator_,&local_98,&local_78);
  Var::~Var(&local_78);
  if (RVar3.enum_ != Error) {
    this_00 = this->istream_;
    pTVar1 = (this->validator_).typechecker_.type_stack_.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar2 = (this->validator_).typechecker_.type_stack_.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    IVar4 = SharedValidator::GetLocalCount(&this->validator_);
    Istream::Emit(this_00,LocalTee,
                  (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3) + (IVar4 - param_1));
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLocalTeeExpr(Index local_index) {
  CHECK_RESULT(
      validator_.OnLocalTee(GetLocation(), Var(local_index, GetLocation())));

  istream_.Emit(Opcode::LocalTee, TranslateLocalIndex(local_index));
  return Result::Ok;
}